

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void decompressBlockAlpha16bitC
               (uint8 *data,uint8 *img,int width,int height,int ix,int iy,int channels)

{
  byte bVar1;
  uint uVar2;
  uint base;
  int iVar3;
  ushort uVar4;
  long lVar5;
  int iVar6;
  int y;
  long lVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int elevenbase;
  
  iVar3 = formatSigned;
  bVar1 = data[1];
  base = (int)(char)*data + 0x80;
  if (formatSigned == 0) {
    base = (uint)*data;
  }
  uVar10 = bVar1 >> 1 & 0xfffffff8;
  if (bVar1 < 0x10) {
    uVar10 = 1;
  }
  iVar6 = 2;
  lVar5 = 0;
  iVar14 = 0;
  do {
    lVar7 = 0;
    do {
      uVar11 = 0;
      iVar8 = -5;
      cVar9 = '\x05';
      iVar13 = iVar14;
      do {
        iVar14 = iVar13 + 1;
        if (6 < iVar13) {
          iVar14 = 0;
        }
        uVar12 = 1 << ((byte)-(iVar13 + -7) & 0x1f) & (uint)data[iVar6];
        uVar2 = uVar12 << ((char)iVar13 + (char)iVar8 & 0x1fU);
        if (iVar8 + 7 < -(iVar13 + -7)) {
          uVar2 = uVar12 >> (cVar9 - (char)iVar13 & 0x1fU);
        }
        uVar11 = uVar11 | uVar2 & 0xff;
        iVar6 = iVar6 + (uint)(6 < iVar13);
        iVar8 = iVar8 + -1;
        cVar9 = cVar9 + '\x01';
        iVar13 = iVar14;
      } while (iVar8 != -8);
      if (iVar3 == 0) {
        uVar2 = *(uint *)((long)alphaBase[0] +
                         (ulong)(((uVar11 & 0xfffffffc) - uVar11) + 3) * 4 +
                         (ulong)((bVar1 & 0xf) << 4));
        uVar12 = -uVar2;
        if ((uVar11 & 0xfffffffc) == 4) {
          uVar12 = ~uVar2;
        }
        iVar13 = -(uVar12 * uVar10);
        if ((uVar11 & 0xfffffffc) == 4) {
          iVar13 = uVar12 * uVar10;
        }
        uVar11 = iVar13 + base * 8 + 4;
        if ((int)uVar11 < 1) {
          uVar11 = 0;
        }
        if (0x7fe < (int)uVar11) {
          uVar11 = 0x7ff;
        }
        uVar4 = (ushort)(uVar11 >> 6) | (ushort)(uVar11 << 5);
      }
      else {
        uVar4 = get16bits11signed(base,bVar1 & 0xf,(uint)(bVar1 >> 4),uVar11);
      }
      *(ushort *)(img + ((iy + lVar7) * (long)width + ix + lVar5) * (long)channels * 2) = uVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void decompressBlockAlpha16bitC(uint8* data, uint8* img, int width, int height, int ix, int iy, int channels) 
{
	int alpha = data[0];
	int table = data[1];

	if(formatSigned) 
	{
		//if we have a signed format, the base value is given as a signed byte. We convert it to (0-255) here,
		//so more code can be shared with the unsigned mode.
		alpha = *((signed char*)(&data[0]));
		alpha = alpha+128;
	}

	int bit=0;
	int byte=2;
	//extract an alpha value for each pixel.
	for(int x=0; x<4; x++) 
	{
		for(int y=0; y<4; y++) 
		{
			//Extract table index
			int index=0;
			for(int bitpos=0; bitpos<3; bitpos++) 
			{
				index|=getbit(data[byte],7-bit,2-bitpos);
				bit++;
				if(bit>7) 
				{
					bit=0;
					byte++;
				}
			}
			int windex = channels*(2*(ix+x+(iy+y)*width));
#if !PGMOUT
			if(formatSigned)
			{
				*(int16 *)&img[windex] = get16bits11signed(alpha,(table%16),(table/16),index);
			}
			else
			{
				*(uint16 *)&img[windex] = get16bits11bits(alpha,(table%16),(table/16),index);
			}
#else
			//make data compatible with the .pgm format. See the comment in compressBlockAlpha16() for details.
			uint16 uSixteen;
			if (formatSigned)
			{
				//the pgm-format only allows unsigned images,
				//so we add 2^15 to get a 16-bit value.
				uSixteen = get16bits11signed(alpha,(table%16),(table/16),index) + 256*128;
			}
			else
			{
				uSixteen = get16bits11bits(alpha,(table%16),(table/16),index);
			}
			//byte swap for pgm
			img[windex] = uSixteen/256;
			img[windex+1] = uSixteen%256;
#endif

		}
	}			
}